

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

bool GLRParser::isMarkerMovedRight(Production *originalProduction,Production *productionMovedRight)

{
  bool bVar1;
  __type _Var2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar3;
  size_type sVar4;
  string *__lhs;
  string *__rhs;
  ulong uVar5;
  const_reference pvVar6;
  const_reference __rhs_00;
  __type local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  string previoussymbol;
  bool previousMarker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *productionMovedRightTo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *originalProductionTo;
  Production *productionMovedRight_local;
  Production *originalProduction_local;
  
  this = Production::getToP_abi_cxx11_(originalProduction);
  this_00 = Production::getToP_abi_cxx11_(productionMovedRight);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00);
  if (sVar3 == sVar4) {
    __lhs = Production::getFromP_abi_cxx11_(originalProduction);
    __rhs = Production::getFromP_abi_cxx11_(productionMovedRight);
    bVar1 = std::operator!=(__lhs,__rhs);
    if ((!bVar1) && (bVar1 = std::operator==(this,this_00), !bVar1)) {
      previoussymbol.field_2._M_local_buf[0xf] = '\0';
      std::__cxx11::string::string((string *)local_58);
      local_5c = 0;
      do {
        uVar5 = (ulong)local_5c;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(this);
        if (sVar3 <= uVar5) {
          originalProduction_local._7_1_ = true;
LAB_0016f5bb:
          std::__cxx11::string::~string((string *)local_58);
          return originalProduction_local._7_1_;
        }
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(this,(long)local_5c);
        __rhs_00 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(this_00,(long)local_5c);
        bVar1 = std::operator!=(pvVar6,__rhs_00);
        if (bVar1) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(this,(long)local_5c);
          getMarker_abi_cxx11_();
          _Var2 = std::operator==(pvVar6,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (_Var2) {
            previoussymbol.field_2._M_local_buf[0xf] = '\x01';
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(this_00,(long)local_5c);
            std::__cxx11::string::operator=((string *)local_58,(string *)pvVar6);
          }
          else {
            bVar1 = false;
            local_f9 = false;
            if ((previoussymbol.field_2._M_local_buf[0xf] & 1U) != 0) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::at(this,(long)local_5c);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_58,pvVar6);
              local_f9 = false;
              if (_Var2) {
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::at(this_00,(long)local_5c);
                getMarker_abi_cxx11_();
                bVar1 = true;
                local_f9 = std::operator==(pvVar6,&local_b0);
              }
            }
            if (bVar1) {
              std::__cxx11::string::~string((string *)&local_b0);
            }
            if (local_f9 == false) {
              originalProduction_local._7_1_ = false;
              goto LAB_0016f5bb;
            }
            std::__cxx11::string::operator=((string *)local_58,"");
            previoussymbol.field_2._M_local_buf[0xf] = '\0';
          }
        }
        local_5c = local_5c + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool GLRParser::isMarkerMovedRight(Production *originalProduction, Production *productionMovedRight) {
    const auto &originalProductionTo = originalProduction->getToP();
    const auto &productionMovedRightTo = productionMovedRight->getToP();

    if (originalProductionTo.size() != productionMovedRightTo.size() ||
        originalProduction->getFromP() != productionMovedRight->getFromP() ||
        originalProductionTo == productionMovedRightTo) {
        return false;
    }

    bool previousMarker = false;
    std::string previoussymbol;
    for (int i = 0; i < originalProductionTo.size(); ++i) {
        if (originalProductionTo.at(i) != productionMovedRightTo.at(i)) {

            if (originalProductionTo.at(i) == getMarker()) {
                // Case: This is the original marker
                previousMarker = true;
                previoussymbol = productionMovedRightTo.at(i);

            } else if (previousMarker &&
                       previoussymbol == originalProductionTo.at(i) &&
                       productionMovedRightTo.at(i) == getMarker()) {
                // Case: This is the moved marker
                previoussymbol = "";
                previousMarker = false;

            } else {
                return false;
            }
        }
    }
    return true;
}